

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O0

bool __thiscall
ON_Circle::GetTightBoundingBox
          (ON_Circle *this,ON_BoundingBox *tight_bbox,bool bGrowBox,ON_Xform *xform)

{
  double *pdVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double rz;
  double ry;
  double rx;
  undefined1 local_c8 [8];
  ON_Arc arc;
  ON_Xform *xform_local;
  bool bGrowBox_local;
  ON_BoundingBox *tight_bbox_local;
  ON_Circle *this_local;
  
  arc.m_angle.m_t[1] = (double)xform;
  if ((xform == (ON_Xform *)0x0) || (bVar2 = ON_Xform::IsIdentity(xform,0.0), bVar2)) {
    xform_local._7_1_ = bGrowBox;
    if ((bGrowBox) && (bVar2 = ON_BoundingBox::IsValid(tight_bbox), !bVar2)) {
      xform_local._7_1_ = 0;
    }
    dVar4 = this->radius;
    dVar3 = ON_Length2d((this->plane).zaxis.y,(this->plane).zaxis.z);
    dVar4 = dVar4 * dVar3;
    dVar3 = this->radius;
    dVar5 = ON_Length2d((this->plane).zaxis.z,(this->plane).zaxis.x);
    dVar3 = dVar3 * dVar5;
    dVar5 = this->radius;
    dVar6 = ON_Length2d((this->plane).zaxis.x,(this->plane).zaxis.y);
    dVar5 = dVar5 * dVar6;
    if ((xform_local._7_1_ & 1) == 0) {
      (tight_bbox->m_min).x = (this->plane).origin.x - dVar4;
      (tight_bbox->m_max).x = (this->plane).origin.x + dVar4;
      (tight_bbox->m_min).y = (this->plane).origin.y - dVar3;
      (tight_bbox->m_max).y = (this->plane).origin.y + dVar3;
      (tight_bbox->m_min).z = (this->plane).origin.z - dVar5;
      (tight_bbox->m_max).z = (this->plane).origin.z + dVar5;
    }
    else {
      if ((this->plane).origin.x - dVar4 < (tight_bbox->m_min).x) {
        (tight_bbox->m_min).x = (this->plane).origin.x - dVar4;
      }
      dVar6 = (this->plane).origin.x + dVar4;
      if ((tight_bbox->m_max).x <= dVar6 && dVar6 != (tight_bbox->m_max).x) {
        (tight_bbox->m_max).x = (this->plane).origin.x + dVar4;
      }
      if ((this->plane).origin.y - dVar3 < (tight_bbox->m_min).y) {
        (tight_bbox->m_min).y = (this->plane).origin.y - dVar3;
      }
      dVar4 = (this->plane).origin.y + dVar3;
      pdVar1 = &(tight_bbox->m_max).y;
      if (*pdVar1 <= dVar4 && dVar4 != *pdVar1) {
        (tight_bbox->m_max).y = (this->plane).origin.y + dVar3;
      }
      if ((this->plane).origin.z - dVar5 < (tight_bbox->m_min).z) {
        (tight_bbox->m_min).z = (this->plane).origin.z - dVar5;
      }
      dVar4 = (this->plane).origin.z + dVar5;
      pdVar1 = &(tight_bbox->m_max).z;
      if (*pdVar1 <= dVar4 && dVar4 != *pdVar1) {
        (tight_bbox->m_max).z = (this->plane).origin.z + dVar5;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    ON_Arc::ON_Arc((ON_Arc *)local_c8,this,6.283185307179586);
    this_local._7_1_ =
         ON_Arc::GetTightBoundingBox
                   ((ON_Arc *)local_c8,tight_bbox,bGrowBox,(ON_Xform *)arc.m_angle.m_t[1]);
    ON_Arc::~ON_Arc((ON_Arc *)local_c8);
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Circle::GetTightBoundingBox( 
		ON_BoundingBox& tight_bbox, 
    bool bGrowBox,
		const ON_Xform* xform
    ) const
{
  // April 8, 2010 Dale Lear: 
  //   Changed this function to be faster when xform is the identity.
  if ( 0 != xform && !xform->IsIdentity() )
  {
    // The ON_Arc version handles all transformations including
    // ones that are not in rotations.
    ON_Arc arc(*this,2.0*ON_PI);
    return arc.GetTightBoundingBox(tight_bbox,bGrowBox,xform);
  }

  if ( bGrowBox && !tight_bbox.IsValid() )
  {
    bGrowBox = false;
  }

  const double rx = radius*ON_Length2d(plane.zaxis.y, plane.zaxis.z);
  const double ry = radius*ON_Length2d(plane.zaxis.z, plane.zaxis.x);
  const double rz = radius*ON_Length2d(plane.zaxis.x, plane.zaxis.y);
  if ( bGrowBox )
  {    
    if ( plane.origin.x-rx < tight_bbox.m_min.x )
      tight_bbox.m_min.x = plane.origin.x-rx;
    if ( plane.origin.x+rx > tight_bbox.m_max.x )
      tight_bbox.m_max.x = plane.origin.x+rx;
    if ( plane.origin.y-ry < tight_bbox.m_min.y )
      tight_bbox.m_min.y = plane.origin.y-ry;
    if ( plane.origin.y+ry > tight_bbox.m_max.y )
      tight_bbox.m_max.y = plane.origin.y+ry;
    if ( plane.origin.z-rz < tight_bbox.m_min.z )
      tight_bbox.m_min.z = plane.origin.z-rz;
    if ( plane.origin.z+rz > tight_bbox.m_max.z )
      tight_bbox.m_max.z = plane.origin.z+rz;
  }
  else
  {
    tight_bbox.m_min.x = plane.origin.x-rx;
    tight_bbox.m_max.x = plane.origin.x+rx;
    tight_bbox.m_min.y = plane.origin.y-ry;
    tight_bbox.m_max.y = plane.origin.y+ry;
    tight_bbox.m_min.z = plane.origin.z-rz;
    tight_bbox.m_max.z = plane.origin.z+rz;
  }  

  return true;  
}